

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_mlvec.cpp
# Opt level: O0

MPP_RET vpu_api_mlvec_set_st_cfg(VpuApiMlvec ctx,VpuApiMlvecStaticCfg *cfg)

{
  MPP_RET MVar1;
  uint local_4c;
  long lStack_48;
  MppEncHeaderMode mode;
  MppEncCfg enc_cfg;
  MppApi *mpi;
  MppCtx mpp_ctx;
  VpuApiMlvecImpl *impl;
  VpuApiMlvecStaticCfg *pVStack_20;
  MPP_RET ret;
  VpuApiMlvecStaticCfg *cfg_local;
  VpuApiMlvec ctx_local;
  
  pVStack_20 = cfg;
  cfg_local = (VpuApiMlvecStaticCfg *)ctx;
  if ((ctx == (VpuApiMlvec)0x0) || (cfg == (VpuApiMlvecStaticCfg *)0x0)) {
    _mpp_log_l(2,"vpu_api_mlvec","invalid NULL input ctx %p cfg %p\n","vpu_api_mlvec_set_st_cfg");
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    if ((vpu_api_debug & 0x10000) != 0) {
      _mpp_log_l(4,"vpu_api_mlvec","enter ctx %p cfg %p\n","vpu_api_mlvec_set_st_cfg",ctx,cfg);
    }
    MVar1 = vpu_api_mlvec_check_cfg(pVStack_20);
    if (MVar1 == MPP_OK) {
      impl._4_4_ = 0;
      mpp_ctx = cfg_local;
      memcpy(&cfg_local->enableCabac,pVStack_20,0x40);
      pVStack_20 = (VpuApiMlvecStaticCfg *)((long)mpp_ctx + 0x18);
      mpi = *mpp_ctx;
      enc_cfg = *(MppEncCfg *)((long)mpp_ctx + 8);
      lStack_48 = *(long *)((long)mpp_ctx + 0x10);
      if ((mpi == (MppApi *)0x0) &&
         (_mpp_log_l(2,"vpu_api_mlvec","Assertion %s failed at %s:%d\n",0,"mpp_ctx",
                     "vpu_api_mlvec_set_st_cfg",0x8c), (_mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      if ((enc_cfg == (MppEncCfg)0x0) &&
         (_mpp_log_l(2,"vpu_api_mlvec","Assertion %s failed at %s:%d\n",0,"mpi",
                     "vpu_api_mlvec_set_st_cfg",0x8d), (_mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      if ((lStack_48 == 0) &&
         (_mpp_log_l(2,"vpu_api_mlvec","Assertion %s failed at %s:%d\n",0,"enc_cfg",
                     "vpu_api_mlvec_set_st_cfg",0x8e), (_mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      if ((vpu_api_debug & 0x20000) != 0) {
        _mpp_log_l(4,"vpu_api_mlvec","hdr_on_idr %d\n","vpu_api_mlvec_set_st_cfg",
                   (int)(char)((ulong)*(undefined8 *)((long)pVStack_20 + 0x38) >> 0x10));
      }
      local_4c = (uint)((char)((ulong)*(undefined8 *)((long)pVStack_20 + 0x38) >> 0x10) != '\0');
      impl._4_4_ = (**(code **)((long)enc_cfg + 0x70))(mpi,0x328001,&local_4c);
      if (impl._4_4_ != MPP_OK) {
        _mpp_log_l(2,"vpu_api_mlvec","setup enc header mode %d failed ret %d\n",0,local_4c,
                   impl._4_4_);
      }
      if ((vpu_api_debug & 0x20000) != 0) {
        _mpp_log_l(4,"vpu_api_mlvec","add_prefix %d\n","vpu_api_mlvec_set_st_cfg",
                   (int)(char)((ulong)*(undefined8 *)((long)pVStack_20 + 0x38) >> 0x18));
      }
      mpp_enc_cfg_set_s32(lStack_48,"h264:prefix_mode",
                          (int)(char)((ulong)*(undefined8 *)((long)pVStack_20 + 0x38) >> 0x18));
      if ((vpu_api_debug & 0x20000) != 0) {
        _mpp_log_l(4,"vpu_api_mlvec","slice_mbs  %d\n","vpu_api_mlvec_set_st_cfg",
                   (int)(short)((ulong)*(undefined8 *)((long)pVStack_20 + 0x38) >> 0x20));
      }
      if ((short)((ulong)*(undefined8 *)((long)pVStack_20 + 0x38) >> 0x20) == 0) {
        mpp_enc_cfg_set_u32(lStack_48,"split:mode",0);
      }
      else {
        mpp_enc_cfg_set_u32(lStack_48,"split:mode",2);
        mpp_enc_cfg_set_u32(lStack_48,"split:arg",
                            (int)(short)((ulong)*(undefined8 *)((long)pVStack_20 + 0x38) >> 0x20));
      }
      vpu_api_mlvec_set_dy_max_tid(cfg_local,(int)(char)*(undefined8 *)((long)pVStack_20 + 0x38));
      if ((vpu_api_debug & 0x10000) != 0) {
        _mpp_log_l(4,"vpu_api_mlvec","leave ctx %p ret %d\n","vpu_api_mlvec_set_st_cfg",cfg_local,
                   impl._4_4_);
      }
      ctx_local._4_4_ = impl._4_4_;
    }
    else {
      ctx_local._4_4_ = MPP_NOK;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET vpu_api_mlvec_set_st_cfg(VpuApiMlvec ctx, VpuApiMlvecStaticCfg *cfg)
{
    if (NULL == ctx || NULL == cfg) {
        mpp_err_f("invalid NULL input ctx %p cfg %p\n");
        return MPP_ERR_NULL_PTR;
    }

    mlvec_dbg_func("enter ctx %p cfg %p\n", ctx, cfg);

    /* check mlvec magic word */
    if (vpu_api_mlvec_check_cfg(cfg))
        return MPP_NOK;

    MPP_RET ret = MPP_OK;
    /* update static configure */
    VpuApiMlvecImpl *impl = (VpuApiMlvecImpl *)ctx;

    memcpy(&impl->st_cfg, cfg, sizeof(impl->st_cfg));
    cfg = &impl->st_cfg;

    /* get mpp context and check */
    MppCtx mpp_ctx = impl->mpp;
    MppApi *mpi = impl->mpi;
    MppEncCfg enc_cfg = impl->enc_cfg;

    mpp_assert(mpp_ctx);
    mpp_assert(mpi);
    mpp_assert(enc_cfg);

    /* start control mpp */
    mlvec_dbg_flow("hdr_on_idr %d\n", cfg->hdr_on_idr);
    MppEncHeaderMode mode = cfg->hdr_on_idr ?
                            MPP_ENC_HEADER_MODE_EACH_IDR :
                            MPP_ENC_HEADER_MODE_DEFAULT;

    ret = mpi->control(mpp_ctx, MPP_ENC_SET_HEADER_MODE, &mode);
    if (ret)
        mpp_err("setup enc header mode %d failed ret %d\n", mode, ret);

    mlvec_dbg_flow("add_prefix %d\n", cfg->add_prefix);
    mpp_enc_cfg_set_s32(enc_cfg, "h264:prefix_mode", cfg->add_prefix);

    mlvec_dbg_flow("slice_mbs  %d\n", cfg->slice_mbs);
    if (cfg->slice_mbs) {
        mpp_enc_cfg_set_u32(enc_cfg, "split:mode", MPP_ENC_SPLIT_BY_CTU);
        mpp_enc_cfg_set_u32(enc_cfg, "split:arg", cfg->slice_mbs);
    } else
        mpp_enc_cfg_set_u32(enc_cfg, "split:mode", MPP_ENC_SPLIT_NONE);

    /* NOTE: ltr_frames is already configured */
    vpu_api_mlvec_set_dy_max_tid(ctx, cfg->max_tid);

    mlvec_dbg_func("leave ctx %p ret %d\n", ctx, ret);

    return ret;
}